

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_1352d2::ShellTool::configureAttribute
          (ShellTool *this,ConfigureContext *ctx,StringRef name,StringRef value)

{
  bool bVar1;
  int iVar2;
  Twine *this_00;
  int *__s1;
  size_t sVar3;
  StringRef name_local;
  StringRef value_local;
  Twine local_c8;
  Twine local_b0;
  Twine local_98;
  Twine local_80;
  Twine local_68;
  Twine local_50;
  Twine local_38;
  
  sVar3 = value.Length;
  __s1 = (int *)value.Data;
  name_local.Length = name.Length;
  name_local.Data = name.Data;
  value_local.Data = (char *)__s1;
  value_local.Length = sVar3;
  if ((name_local.Length == 0xf) &&
     (iVar2 = bcmp(name_local.Data,"control-enabled",0xf), iVar2 == 0)) {
    if (sVar3 == 5) {
      iVar2 = bcmp(__s1,"false",5);
      if (iVar2 == 0) {
        bVar1 = false;
        goto LAB_0014983b;
      }
    }
    else if ((sVar3 == 4) && (*__s1 == 0x65757274)) {
      bVar1 = true;
LAB_0014983b:
      this->controlEnabled = bVar1;
      return true;
    }
    llvm::Twine::Twine(&local_38,"invalid value: \'",&value_local);
    llvm::Twine::Twine(&local_50,"\' for attribute \'");
    llvm::Twine::concat(&local_c8,&local_38,&local_50);
    llvm::Twine::Twine(&local_68,&name_local);
    llvm::Twine::concat(&local_b0,&local_c8,&local_68);
    this_00 = &local_80;
    llvm::Twine::Twine(this_00,"\'");
  }
  else {
    llvm::Twine::Twine(&local_b0,"unexpected attribute: \'",&name_local);
    this_00 = &local_c8;
    llvm::Twine::Twine(this_00,"\'");
  }
  llvm::Twine::concat(&local_98,&local_b0,this_00);
  llbuild::buildsystem::ConfigureContext::error(ctx,&local_98);
  return false;
}

Assistant:

virtual bool configureAttribute(const ConfigureContext& ctx, StringRef name,
                                  StringRef value) override {
    if (name == "control-enabled") {
      if (value != "true" && value != "false") {
        ctx.error("invalid value: '" + value + "' for attribute '" +
                  name + "'");
        return false;
      }
      controlEnabled = (value == "true");
    } else {
      ctx.error("unexpected attribute: '" + name + "'");
      return false;
    }
    return true;
  }